

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.cpp
# Opt level: O2

QString * UnixUtils::substituteFileBrowserParameters
                    (QString *__return_storage_ptr__,QString *pre,QString *file)

{
  char16_t cVar1;
  long lVar2;
  char16_t *pcVar3;
  long lVar4;
  int iVar5;
  QArrayDataPointer<char16_t> *this;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QString s;
  QArrayDataPointer<char16_t> local_48;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar5 = 0;
  do {
    lVar4 = (long)iVar5;
    lVar2 = (pre->d).size;
    if (lVar2 <= lVar4) {
      return __return_storage_ptr__;
    }
    pcVar3 = (pre->d).ptr;
    if (lVar4 < lVar2 + -1 && pcVar3[lVar4] == L'%') {
      cVar1 = pcVar3[lVar4 + 1];
      s.d.size = 0;
      s.d.d = (Data *)0x0;
      s.d.ptr = (char16_t *)0x0;
      if (cVar1 == L'%') {
        QString::operator=((QString *)&s.d,(QChar)0x25);
      }
      else {
        if (cVar1 == L'n') {
          FileName::FileName((FileName *)&local_b0,file);
          local_98.d = local_b0.d;
          local_98.ptr = local_b0.ptr;
          local_98.size = local_b0.size;
          if (local_b0.d != (Data *)0x0) {
            LOCK();
            ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          operator+((QString *)&local_80,(QChar)0x22,(QString *)&local_98);
          operator+((QString *)&local_48,(QString *)&local_80,(QChar)0x22);
          QString::operator=((QString *)&s.d,(QString *)&local_48);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          this = &local_b0;
        }
        else {
          if (cVar1 != L'f') {
            if (cVar1 == L'd') {
              QFileInfo::QFileInfo((QFileInfo *)&local_b0,(QString *)file);
              QFileInfo::path();
              operator+((QString *)&local_80,(QChar)0x22,(QString *)&local_98);
              operator+((QString *)&local_48,(QString *)&local_80,(QChar)0x22);
              QString::operator=((QString *)&s.d,(QString *)&local_48);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
              QFileInfo::~QFileInfo((QFileInfo *)&local_b0);
            }
            else {
              QString::operator=((QString *)&s.d,(QChar)0x25);
              QString::append((QChar)(char16_t)&s.d);
            }
            goto LAB_0012bf30;
          }
          this = &local_80;
          operator+((QString *)this,(QChar)0x22,file);
          operator+((QString *)&local_48,(QString *)this,(QChar)0x22);
          QString::operator=((QString *)&s.d,(QString *)&local_48);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
      }
LAB_0012bf30:
      QString::append((QString *)__return_storage_ptr__);
      iVar5 = iVar5 + 1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&s.d);
    }
    else {
      QString::append((QChar)(char16_t)__return_storage_ptr__);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

QString UnixUtils::substituteFileBrowserParameters(const QString &pre, const QString &file)
{
    QString cmd;
    for (int i = 0; i < pre.size(); ++i) {
        QChar c = pre.at(i);
        if (c == QLatin1Char('%') && i < pre.size()-1) {
            c = pre.at(++i);
            QString s;
            if (c == QLatin1Char('d')) {
                s = QLatin1Char('"') + QFileInfo(file).path() + QLatin1Char('"');
            } else if (c == QLatin1Char('f')) {
                s = QLatin1Char('"') + file + QLatin1Char('"');
            } else if (c == QLatin1Char('n')) {
                s = QLatin1Char('"') + FileName::fromString(file).fileName() + QLatin1Char('"');
            } else if (c == QLatin1Char('%')) {
                s = c;
            } else {
                s = QLatin1Char('%');
                s += c;
            }
            cmd += s;
            continue;
        }
        cmd += c;
    }
    return cmd;
}